

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O3

Cut_Cut_t * Cut_NodeUnionCutsSeq(Cut_Man_t *p,Vec_Int_t *vNodes,int CutSetNum,int fFirst)

{
  uint uVar1;
  uint uVar2;
  Cut_Cut_t *pCVar3;
  __time_t pList;
  int iVar4;
  int iVar5;
  long lVar6;
  Cut_Cut_t *pCVar7;
  void **ppvVar8;
  timespec *ptVar9;
  Vec_Ptr_t *pVVar10;
  long lVar11;
  Cut_Cut_t *pCVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  undefined1 auVar16 [16];
  Cut_Cut_t *pHead;
  Cut_List_t Super;
  Cut_Cut_t *local_128;
  timespec local_118;
  ulong local_108;
  Cut_List_t local_100;
  
  uVar1 = p->pParams->nVarsMax;
  iVar4 = clock_gettime(3,(timespec *)&local_100);
  if (iVar4 < 0) {
    lVar11 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_100.pHead[1]),8);
    lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + (long)local_100.pHead[0] * -1000000;
  }
  local_100.pHead[1] = (Cut_Cut_t *)0x0;
  local_100.pHead[2] = (Cut_Cut_t *)0x0;
  local_100.pHead[3] = (Cut_Cut_t *)0x0;
  local_100.pHead[4] = (Cut_Cut_t *)0x0;
  local_100.pHead[5] = (Cut_Cut_t *)0x0;
  local_100.pHead[6] = (Cut_Cut_t *)0x0;
  local_100.pHead[7] = (Cut_Cut_t *)0x0;
  local_100.pHead[8] = (Cut_Cut_t *)0x0;
  local_100.pHead[9] = (Cut_Cut_t *)0x0;
  local_100.pHead[10] = (Cut_Cut_t *)0x0;
  local_100.pHead[0xb] = (Cut_Cut_t *)0x0;
  local_100.pHead[0xc] = (Cut_Cut_t *)0x0;
  lVar14 = 1;
  lVar15 = 2;
  lVar6 = 0xe;
  auVar16._8_4_ = (int)&local_100;
  auVar16._0_8_ = &local_100;
  auVar16._12_4_ = (int)((ulong)&local_100 >> 0x20);
  do {
    local_100.pHead[lVar6] = (Cut_Cut_t *)(local_100.pHead + lVar14);
    local_100.pHead[lVar6 + 1] = (Cut_Cut_t *)(lVar15 * 8 + auVar16._8_8_);
    lVar14 = lVar14 + 2;
    lVar15 = lVar15 + 2;
    lVar6 = lVar6 + 2;
  } while (lVar6 != 0x1a);
  if (vNodes->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar4 = *vNodes->pArray;
  p->nNodeCuts = 1;
  pCVar7 = Cut_NodeReadCutsOld(p,iVar4);
  p->pCompareOld = pCVar7;
  if (CutSetNum < 0) {
    pCVar7 = (Cut_Cut_t *)0x0;
  }
  else {
    pCVar7 = Cut_NodeReadCutsNew(p,iVar4);
  }
  p->pCompareNew = pCVar7;
  local_128 = Cut_NodeReadCutsOld(p,iVar4);
  if ((local_128 == (Cut_Cut_t *)0x0) &&
     (local_128 = Cut_NodeReadCutsNew(p,iVar4), local_128 == (Cut_Cut_t *)0x0)) {
    __assert_fail("pTop != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutNode.c"
                  ,0x331,"Cut_Cut_t *Cut_NodeUnionCutsSeq(Cut_Man_t *, Vec_Int_t *, int, int)");
  }
  p->vTemp->nSize = 0;
  if (0 < vNodes->nSize) {
    lVar14 = 1;
    lVar6 = 0;
    do {
      if (lVar6 == 0 && -1 < CutSetNum) {
        pCVar7 = Cut_NodeReadCutsTemp(p,CutSetNum);
        Cut_NodeWriteCutsTemp(p,CutSetNum,(Cut_Cut_t *)0x0);
      }
      else {
        iVar5 = vNodes->pArray[lVar6];
        pCVar7 = Cut_NodeReadCutsNew(p,iVar5);
        Cut_NodeWriteCutsNew(p,iVar5,(Cut_Cut_t *)0x0);
      }
      if (pCVar7 != (Cut_Cut_t *)0x0) {
        if (fFirst == 0) goto LAB_004b72cc;
        pCVar12 = pCVar7->pNext;
        pCVar7->pNext = (Cut_Cut_t *)0x0;
        if (lVar6 == 0) {
          if (0xbfffffff < *(uint *)pCVar7 + 0xf0000000) {
LAB_004b776b:
            __assert_fail("pCut->nLeaves > 0 && pCut->nLeaves <= CUT_SIZE_MAX",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutList.h"
                          ,0x59,"void Cut_ListAdd(Cut_List_t *, Cut_Cut_t *)");
          }
          *local_100.ppTail[*(uint *)pCVar7 >> 0x1c] = pCVar7;
          local_100.ppTail[*(uint *)pCVar7 >> 0x1c] = &pCVar7->pNext;
        }
        else {
          Cut_CutRecycle(p,pCVar7);
        }
        while (pCVar7 = pCVar12, pCVar12 != (Cut_Cut_t *)0x0) {
LAB_004b72cc:
          if (*(uint *)pCVar7 >> 0x1c == uVar1) {
            pVVar10 = p->vTemp;
            uVar2 = pVVar10->nSize;
            uVar13 = (ulong)uVar2;
            if (uVar2 == pVVar10->nCap) {
              if ((int)uVar2 < 0x10) {
                if (pVVar10->pArray == (void **)0x0) {
                  ppvVar8 = (void **)malloc(0x80);
                }
                else {
                  ppvVar8 = (void **)realloc(pVVar10->pArray,0x80);
                }
                pVVar10->pArray = ppvVar8;
                pVVar10->nCap = 0x10;
              }
              else {
                local_108 = uVar13;
                if (pVVar10->pArray == (void **)0x0) {
                  ppvVar8 = (void **)malloc(uVar13 << 4);
                }
                else {
                  ppvVar8 = (void **)realloc(pVVar10->pArray,uVar13 << 4);
                }
                pVVar10->pArray = ppvVar8;
                pVVar10->nCap = (int)local_108 * 2;
              }
            }
            else {
              ppvVar8 = pVVar10->pArray;
            }
            iVar5 = pVVar10->nSize;
            pVVar10->nSize = iVar5 + 1;
            ppvVar8[iVar5] = pCVar7;
            break;
          }
          pCVar12 = pCVar7->pNext;
          if ((p->pParams->fFilter == 0) ||
             ((iVar5 = Cut_CutFilterOne(p,&local_100,pCVar7), iVar5 == 0 &&
              ((p->pParams->fSeq == 0 ||
               (((p->pCompareOld == (Cut_Cut_t *)0x0 ||
                 (iVar5 = Cut_CutFilterOld(p,p->pCompareOld,pCVar7), iVar5 == 0)) &&
                ((p->pCompareNew == (Cut_Cut_t *)0x0 ||
                 (iVar5 = Cut_CutFilterOld(p,p->pCompareNew,pCVar7), iVar5 == 0)))))))))) {
            uVar2 = *(uint *)pCVar7;
            *(uint *)pCVar7 = (uVar2 & 0xff7fffff) + ((*(uint *)local_128 ^ uVar2) & 0x400000) * 2;
            pCVar3 = pCVar7->pNext;
            pCVar7->pNext = (Cut_Cut_t *)0x0;
            if (0xbfffffff < uVar2 + 0xf0000000) goto LAB_004b776b;
            *local_100.ppTail[uVar2 >> 0x1c] = pCVar7;
            local_100.ppTail[*(uint *)pCVar7 >> 0x1c] = &pCVar7->pNext;
            iVar5 = p->nNodeCuts + 1;
            p->nNodeCuts = iVar5;
            if (iVar5 == p->pParams->nKeepMax) goto joined_r0x004b759d;
          }
        }
      }
      lVar6 = lVar6 + 1;
      lVar14 = lVar14 + 1;
    } while (lVar6 < vNodes->nSize);
    pVVar10 = p->vTemp;
    if (0 < pVVar10->nSize) {
      lVar6 = 1;
      lVar14 = 0;
      do {
        pCVar7 = (Cut_Cut_t *)pVVar10->pArray[lVar14];
        if ((Cut_Cut_t *)pVVar10->pArray[lVar14] != (Cut_Cut_t *)0x0) {
          do {
            pCVar12 = pCVar7->pNext;
            if ((p->pParams->fFilter == 0) ||
               ((iVar5 = Cut_CutFilterOne(p,&local_100,pCVar7), iVar5 == 0 &&
                ((p->pParams->fSeq == 0 ||
                 (((p->pCompareOld == (Cut_Cut_t *)0x0 ||
                   (iVar5 = Cut_CutFilterOld(p,p->pCompareOld,pCVar7), iVar5 == 0)) &&
                  ((p->pCompareNew == (Cut_Cut_t *)0x0 ||
                   (iVar5 = Cut_CutFilterOld(p,p->pCompareNew,pCVar7), iVar5 == 0)))))))))) {
              uVar1 = *(uint *)pCVar7;
              *(uint *)pCVar7 = (uVar1 & 0xff7fffff) + ((*(uint *)local_128 ^ uVar1) & 0x400000) * 2
              ;
              pCVar3 = pCVar7->pNext;
              pCVar7->pNext = (Cut_Cut_t *)0x0;
              if (0xbfffffff < uVar1 + 0xf0000000) goto LAB_004b776b;
              *local_100.ppTail[uVar1 >> 0x1c] = pCVar7;
              local_100.ppTail[*(uint *)pCVar7 >> 0x1c] = &pCVar7->pNext;
              iVar5 = p->nNodeCuts + 1;
              p->nNodeCuts = iVar5;
              if (iVar5 == p->pParams->nKeepMax) goto joined_r0x004b770c;
            }
            pCVar7 = pCVar12;
          } while (pCVar12 != (Cut_Cut_t *)0x0);
          pVVar10 = p->vTemp;
        }
        lVar14 = lVar14 + 1;
        lVar6 = lVar6 + 1;
      } while (lVar14 < pVVar10->nSize);
    }
  }
LAB_004b7618:
  ptVar9 = &local_118;
  local_118.tv_sec = 0;
  lVar6 = 1;
  do {
    if (local_100.pHead[lVar6] != (Cut_Cut_t *)0x0) {
      ptVar9->tv_sec = (__time_t)local_100.pHead[lVar6];
      ptVar9 = (timespec *)local_100.ppTail[lVar6];
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0xd);
  ptVar9->tv_sec = 0;
  pList = local_118.tv_sec;
  if (CutSetNum < 0) {
    pCVar7 = Cut_NodeReadCutsNew(p,iVar4);
    if (pCVar7 != (Cut_Cut_t *)0x0) {
      __assert_fail("Cut_NodeReadCutsNew(p, Root) == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutNode.c"
                    ,0x3b8,"Cut_Cut_t *Cut_NodeUnionCutsSeq(Cut_Man_t *, Vec_Int_t *, int, int)");
    }
    Cut_NodeWriteCutsNew(p,iVar4,(Cut_Cut_t *)pList);
  }
  else {
    pCVar7 = Cut_NodeReadCutsTemp(p,CutSetNum);
    if (pCVar7 != (Cut_Cut_t *)0x0) {
      __assert_fail("Cut_NodeReadCutsTemp(p, CutSetNum) == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutNode.c"
                    ,0x3b3,"Cut_Cut_t *Cut_NodeUnionCutsSeq(Cut_Man_t *, Vec_Int_t *, int, int)");
    }
    Cut_NodeWriteCutsTemp(p,CutSetNum,(Cut_Cut_t *)pList);
  }
  iVar4 = clock_gettime(3,&local_118);
  if (iVar4 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_118.tv_nsec / 1000 + local_118.tv_sec * 1000000;
  }
  p->timeUnion = p->timeUnion + lVar6 + lVar11;
  return (Cut_Cut_t *)pList;
joined_r0x004b759d:
  while (pCVar3 != (Cut_Cut_t *)0x0) {
    pCVar7 = pCVar3->pNext;
    Cut_CutRecycle(p,pCVar3);
    pCVar3 = pCVar7;
  }
  if ((int)lVar6 + 1 < vNodes->nSize) {
    do {
      Cut_NodeFreeCuts(p,vNodes->pArray[lVar14]);
      lVar14 = lVar14 + 1;
    } while ((int)lVar14 < vNodes->nSize);
  }
  pVVar10 = p->vTemp;
  if (0 < pVVar10->nSize) {
    lVar6 = 0;
    do {
      pCVar7 = (Cut_Cut_t *)pVVar10->pArray[lVar6];
      if ((Cut_Cut_t *)pVVar10->pArray[lVar6] != (Cut_Cut_t *)0x0) {
        do {
          pCVar12 = pCVar7->pNext;
          Cut_CutRecycle(p,pCVar7);
          pCVar7 = pCVar12;
        } while (pCVar12 != (Cut_Cut_t *)0x0);
        pVVar10 = p->vTemp;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < pVVar10->nSize);
  }
  goto LAB_004b7618;
joined_r0x004b770c:
  while (pCVar3 != (Cut_Cut_t *)0x0) {
    pCVar7 = pCVar3->pNext;
    Cut_CutRecycle(p,pCVar3);
    pCVar3 = pCVar7;
  }
  pVVar10 = p->vTemp;
  if ((int)lVar14 + 1 < pVVar10->nSize) {
    do {
      pCVar7 = (Cut_Cut_t *)pVVar10->pArray[lVar6];
      if ((Cut_Cut_t *)pVVar10->pArray[lVar6] != (Cut_Cut_t *)0x0) {
        do {
          pCVar12 = pCVar7->pNext;
          Cut_CutRecycle(p,pCVar7);
          pCVar7 = pCVar12;
        } while (pCVar12 != (Cut_Cut_t *)0x0);
        pVVar10 = p->vTemp;
      }
      lVar6 = lVar6 + 1;
    } while ((int)lVar6 < pVVar10->nSize);
  }
  goto LAB_004b7618;
}

Assistant:

Cut_Cut_t * Cut_NodeUnionCutsSeq( Cut_Man_t * p, Vec_Int_t * vNodes, int CutSetNum, int fFirst )
{
    Cut_List_t Super, * pSuper = &Super;
    Cut_Cut_t * pList, * pListStart, * pCut, * pCut2, * pTop;
    int i, k, Node, Root, Limit = p->pParams->nVarsMax;
    abctime clk = Abc_Clock();

    // start the new list
    Cut_ListStart( pSuper );

    // remember the root node to save the resulting cuts
    Root = Vec_IntEntry( vNodes, 0 );
    p->nNodeCuts = 1;

    // store the original lists for comparison
    p->pCompareOld = Cut_NodeReadCutsOld( p, Root );
    p->pCompareNew = (CutSetNum >= 0)? Cut_NodeReadCutsNew( p, Root ) : NULL;

    // get the topmost cut
    pTop = NULL;
    if ( (pTop = Cut_NodeReadCutsOld( p, Root )) == NULL )
        pTop = Cut_NodeReadCutsNew( p, Root );
    assert( pTop != NULL );

    // collect small cuts first
    Vec_PtrClear( p->vTemp );
    Vec_IntForEachEntry( vNodes, Node, i )
    {
        // get the cuts of this node
        if ( i == 0 && CutSetNum >= 0 )
        {
            pList = Cut_NodeReadCutsTemp( p, CutSetNum );
            Cut_NodeWriteCutsTemp( p, CutSetNum, NULL );
        }
        else
        {
            pList = Cut_NodeReadCutsNew( p, Node );
            Cut_NodeWriteCutsNew( p, Node, NULL );
        }
        if ( pList == NULL )
            continue;

        // process the cuts
        if ( fFirst )
        {
            // remember the starting point
            pListStart = pList->pNext;
            pList->pNext = NULL;
            // save or recycle the elementary cut
            if ( i == 0 )
                Cut_ListAdd( pSuper, pList );
            else
                Cut_CutRecycle( p, pList );
        }
        else
            pListStart = pList;

        // save all the cuts that are smaller than the limit
        Cut_ListForEachCutSafe( pListStart, pCut, pCut2 )
        {
            if ( pCut->nLeaves == (unsigned)Limit )
            {
                Vec_PtrPush( p->vTemp, pCut );
                break;
            }
            // check containment
//            if ( p->pParams->fFilter && Cut_CutFilterOne( p, pSuper, pCut ) )
//                continue;
            if ( p->pParams->fFilter )
            {
                if ( Cut_CutFilterOne(p, pSuper, pCut) )
                    continue;
                if ( p->pParams->fSeq )
                {
                    if ( p->pCompareOld && Cut_CutFilterOld(p, p->pCompareOld, pCut) )
                        continue;
                    if ( p->pCompareNew && Cut_CutFilterOld(p, p->pCompareNew, pCut) )
                        continue;
                }
            }

            // set the complemented bit by comparing the first cut with the current cut
            pCut->fCompl = pTop->fSimul ^ pCut->fSimul;
            pListStart = pCut->pNext;
            pCut->pNext = NULL;
            // add to the list
            Cut_ListAdd( pSuper, pCut );
            if ( ++p->nNodeCuts == p->pParams->nKeepMax )
            {
                // recycle the rest of the cuts of this node
                Cut_ListForEachCutSafe( pListStart, pCut, pCut2 )
                    Cut_CutRecycle( p, pCut );
                // recycle all cuts of other nodes
                Vec_IntForEachEntryStart( vNodes, Node, k, i+1 )
                    Cut_NodeFreeCuts( p, Node );
                // recycle the saved cuts of other nodes
                Vec_PtrForEachEntry( Cut_Cut_t *, p->vTemp, pList, k )
                    Cut_ListForEachCutSafe( pList, pCut, pCut2 )
                        Cut_CutRecycle( p, pCut );
                goto finish;
            }
        }
    } 
    // collect larger cuts next
    Vec_PtrForEachEntry( Cut_Cut_t *, p->vTemp, pList, i )
    {
        Cut_ListForEachCutSafe( pList, pCut, pCut2 )
        {
            // check containment
//            if ( p->pParams->fFilter && Cut_CutFilterOne( p, pSuper, pCut ) )
//                continue;
            if ( p->pParams->fFilter )
            {
                if ( Cut_CutFilterOne(p, pSuper, pCut) )
                    continue;
                if ( p->pParams->fSeq )
                {
                    if ( p->pCompareOld && Cut_CutFilterOld(p, p->pCompareOld, pCut) )
                        continue;
                    if ( p->pCompareNew && Cut_CutFilterOld(p, p->pCompareNew, pCut) )
                        continue;
                }
            }

            // set the complemented bit
            pCut->fCompl = pTop->fSimul ^ pCut->fSimul;
            pListStart   = pCut->pNext;
            pCut->pNext  = NULL;
            // add to the list
            Cut_ListAdd( pSuper, pCut );
            if ( ++p->nNodeCuts == p->pParams->nKeepMax )
            {
                // recycle the rest of the cuts
                Cut_ListForEachCutSafe( pListStart, pCut, pCut2 )
                    Cut_CutRecycle( p, pCut );
                // recycle the saved cuts of other nodes
                Vec_PtrForEachEntryStart( Cut_Cut_t *, p->vTemp, pList, k, i+1 )
                    Cut_ListForEachCutSafe( pList, pCut, pCut2 )
                        Cut_CutRecycle( p, pCut );
                goto finish;
            }
        }
    }
finish :
    // set the cuts at the node
    pList = Cut_ListFinish( pSuper );

    // set the lists at the node
//    assert( Cut_NodeReadCutsNew(p, Root) == NULL );
//    Cut_NodeWriteCutsNew( p, Root, pList );
    if ( CutSetNum >= 0 )
    {
        assert( Cut_NodeReadCutsTemp(p, CutSetNum) == NULL );
        Cut_NodeWriteCutsTemp( p, CutSetNum, pList );
    }
    else
    {
        assert( Cut_NodeReadCutsNew(p, Root) == NULL );
        Cut_NodeWriteCutsNew( p, Root, pList );
    }

p->timeUnion += Abc_Clock() - clk;
    // filter the cuts
//clk = Abc_Clock();
//    if ( p->pParams->fFilter )
//        Cut_CutFilter( p, pList );
//p->timeFilter += Abc_Clock() - clk;
//    if ( fFirst )
//        p->nNodes -= vNodes->nSize - 1;
    return pList;
}